

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

TermList Kernel::SubstHelper::
         applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                   (TermList trm,Substitution *applicator,bool noSharing)

{
  bool bVar1;
  undefined1 in_DL;
  Substitution *in_RSI;
  undefined1 in_stack_0000039f;
  Substitution *in_stack_000003a0;
  Term *in_stack_000003a8;
  Term *in_stack_ffffffffffffffc8;
  TermList *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffe4;
  uint var;
  TermList local_10;
  uint64_t local_8;
  
  var = CONCAT13(in_DL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  bVar1 = TermList::isOrdinaryVar((TermList *)0x3d5840);
  if (bVar1) {
    TermList::var(&local_10);
    local_8 = (uint64_t)
              Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::
              Substitution::apply(in_RSI,var);
  }
  else {
    bVar1 = TermList::isSpecialVar((TermList *)0x3d5877);
    if (bVar1) {
      TermList::var(&local_10);
      local_8 = (uint64_t)
                SubstHelper_Aux::SpecVarHandler<false>::
                apply<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                          ((Substitution *)in_stack_ffffffffffffffc8,0);
    }
    else {
      TermList::term((TermList *)0x3d58ae);
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                (in_stack_000003a8,in_stack_000003a0,(bool)in_stack_0000039f);
      TermList::TermList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return (TermList)local_8;
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}